

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O2

void __thiscall rcg::Device::abortWaitingForModuleEvents(Device *this)

{
  std::mutex::lock(&this->mtx);
  if (this->event != (EVENT_HANDLE)0x0) {
    (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->EventKill)(this->event);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return;
}

Assistant:

void Device::abortWaitingForModuleEvents()
{
  std::lock_guard<std::mutex> lock(mtx);

  if (event != 0)
  {
    gentl->EventKill(event);
  }
}